

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.h
# Opt level: O3

void __thiscall winmd::reader::TypeSig::TypeSig(TypeSig *this,table_base *table,byte_view *data)

{
  pointer puVar1;
  pointer puVar2;
  ElementType EVar3;
  int iVar4;
  vector<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_> *result;
  byte_view cursor;
  uint8_t *local_58;
  pointer puStack_50;
  pointer puStack_48;
  pointer local_40;
  table_base *local_38;
  
  local_58 = data->m_first;
  puStack_50 = (pointer)data->m_last;
  EVar3 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  if (EVar3 == SZArray) {
    data->m_first = local_58;
    data->m_last = (uint8_t *)puStack_50;
  }
  this->m_is_szarray = EVar3 == SZArray;
  local_58 = data->m_first;
  puStack_50 = (pointer)data->m_last;
  EVar3 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  if (EVar3 == Array) {
    data->m_first = local_58;
    data->m_last = (uint8_t *)puStack_50;
  }
  this->m_is_array = EVar3 == Array;
  local_58 = data->m_first;
  puStack_50 = (pointer)data->m_last;
  EVar3 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  iVar4 = 0;
  if (EVar3 == Ptr) {
    iVar4 = 0;
    do {
      iVar4 = iVar4 + 1;
      data->m_first = local_58;
      data->m_last = (uint8_t *)puStack_50;
      EVar3 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
    } while (EVar3 == Ptr);
  }
  this->m_ptr_count = iVar4;
  (this->m_cmod).
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_cmod).
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_cmod).
  super__Vector_base<winmd::reader::CustomModSig,_std::allocator<winmd::reader::CustomModSig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = data->m_first;
  puStack_50 = (pointer)data->m_last;
  local_38 = table;
  EVar3 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  while ((byte)(EVar3 - CModReqd) < 2) {
    std::vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>>::
    emplace_back<winmd::reader::table_base_const*&,winmd::reader::byte_view&>
              ((vector<winmd::reader::CustomModSig,std::allocator<winmd::reader::CustomModSig>> *)
               &this->m_cmod,&local_38,data);
    local_58 = data->m_first;
    puStack_50 = (pointer)data->m_last;
    EVar3 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  }
  local_58 = data->m_first;
  puStack_50 = (pointer)data->m_last;
  EVar3 = uncompress_enum<winmd::reader::ElementType>((byte_view *)&local_58);
  this->m_element_type = EVar3;
  ParseType(&this->m_type,table,data);
  this->m_array_rank = 0;
  (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_is_array == true) {
    parse_array_sizes((pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       *)&local_58,table,data);
    this->m_array_rank = (uint32_t)local_58;
    puVar1 = (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = puStack_50;
    (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_48;
    (this->m_array_sizes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_40;
    puStack_50 = (pointer)0x0;
    puStack_48 = (pointer)0x0;
    local_40 = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)puVar2 - (long)puVar1);
      if (puStack_50 != (pointer)0x0) {
        operator_delete(puStack_50,(long)local_40 - (long)puStack_50);
      }
    }
  }
  return;
}

Assistant:

TypeSig(table_base const* table, byte_view& data)
            : m_is_szarray(parse_szarray(table, data))
            , m_is_array(parse_array(table, data))
            , m_ptr_count(parse_ptr(table, data))
            , m_cmod(parse_cmods(table, data))
            , m_element_type(parse_element_type(data))
            , m_type(ParseType(table, data))
        {
            if (m_is_array)
            {
                std::tie(m_array_rank, m_array_sizes) = parse_array_sizes(table, data);
            }
        }